

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureMS5611.cpp
# Opt level: O0

bool __thiscall RTPressureMS5611::pressureInit(RTPressureMS5611 *this)

{
  bool bVar1;
  int local_20;
  byte local_1b;
  byte local_1a;
  uchar local_19;
  int i;
  uchar data [2];
  uchar cmd;
  RTPressureMS5611 *this_local;
  
  local_19 = 0xa2;
  this->m_pressureAddr = ((this->super_RTPressure).m_settings)->m_I2CPressureAddress;
  local_20 = 0;
  _i = this;
  while( true ) {
    if (5 < local_20) {
      this->m_state = 0;
      return true;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                              this->m_pressureAddr,local_19,'\x02',&local_1b,
                              "Failed to read MS5611 calibration data");
    if (!bVar1) break;
    this->m_calData[local_20] = (ushort)local_1b * 0x100 + (ushort)local_1a;
    local_19 = local_19 + '\x02';
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

bool RTPressureMS5611::pressureInit()
{
    unsigned char cmd = MS5611_CMD_PROM + 2;
    unsigned char data[2];

    m_pressureAddr = m_settings->m_I2CPressureAddress;

    // get calibration data

    for (int i = 0; i < 6; i++) {
        if (!m_settings->HALRead(m_pressureAddr, cmd, 2, data, "Failed to read MS5611 calibration data"))
            return false;
        m_calData[i] = (((uint16_t)data[0]) << 8) + (uint16_t)data[1];
        // printf("Cal index: %d, data: %d\n", i, m_calData[i]);
        cmd += 2;
    }

    m_state = MS5611_STATE_IDLE;
    return true;
}